

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matchit.h
# Opt level: O0

enable_if_t<isTupleLikeV<const_std::tuple<mathiu::impl::RelationalKind,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_&>,_bool>
 matchit::impl::
 PatternTraits<matchit::impl::Ds<matchit::impl::Id<mathiu::impl::RelationalKind>,matchit::impl::Id<std::shared_ptr<mathiu::impl::Expr_const>>,matchit::impl::Id<std::shared_ptr<mathiu::impl::Expr_const>>>>
 ::
 matchPatternImpl<std::tuple<mathiu::impl::RelationalKind,std::shared_ptr<mathiu::impl::Expr_const>,std::shared_ptr<mathiu::impl::Expr_const>>const&,matchit::impl::Context<int_const*,bool,mathiu::impl::Fraction_const*,bool,mathiu::impl::Symbol_const*,bool,mathiu::impl::Sum_const*,bool,mathiu::impl::Product_const*,bool,mathiu::impl::Power_const*,bool,mathiu::impl::Log_const*,bool,mathiu::impl::Sin_const*,bool,mathiu::impl::Pi_const*,bool,mathiu::impl::E_const*,bool,mathiu::impl::I_const*,bool,mathiu::impl::Infinity_const*,bool,mathiu::impl::Set_const*,bool,mathiu::impl::List_const*,bool,mathiu::impl::PieceWise_const*,bool,std::tuple<mathiu::impl::RelationalKind,std::shared_ptr<mathiu::impl::Expr_const>,std::shared_ptr<mathiu::impl::Expr_const>>const*,bool,mathiu::impl::Pair_const*,bool,std::pair<std::shared_ptr<mathiu::impl::Expr_const>,std::shared_ptr<mathiu::impl::Expr_const>>const*,bool,std::pair<std::pair<std::shared_ptr<mathiu::impl::Expr_const>,bool>,std::pair<std::shared_ptr<mathiu::impl::Expr_const>,bool>>const*,bool,mathiu::impl::True_const*,bool,mathiu::impl::False_const*,bool,mathiu::impl::Logical_const*,bool,mathiu::impl::And_const*,bool,mathiu::impl::Logical_const*,bool,mathiu::impl::Or_const*,bool,mathiu::impl::SetOp_const*,bool,mathiu::impl::Union_const*,bool,mathiu::impl::SetOp_const*,bool,mathiu::impl::Intersection_const*,bool,mathiu::impl::SetOp_const*,bool,mathiu::impl::Difference_const*,bool>>
           (tuple<mathiu::impl::RelationalKind,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>
            *valueTuple,
           Ds<matchit::impl::Id<mathiu::impl::RelationalKind>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>
           *dsPat,int32_t depth,
           Context<const_int_*,_bool,_const_mathiu::impl::Fraction_*,_bool,_const_mathiu::impl::Symbol_*,_bool,_const_mathiu::impl::Sum_*,_bool,_const_mathiu::impl::Product_*,_bool,_const_mathiu::impl::Power_*,_bool,_const_mathiu::impl::Log_*,_bool,_const_mathiu::impl::Sin_*,_bool,_const_mathiu::impl::Pi_*,_bool,_const_mathiu::impl::E_*,_bool,_const_mathiu::impl::I_*,_bool,_const_mathiu::impl::Infinity_*,_bool,_const_mathiu::impl::Set_*,_bool,_const_mathiu::impl::List_*,_bool,_const_mathiu::impl::PieceWise_*,_bool,_const_std::tuple<mathiu::impl::RelationalKind,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_*,_bool,_const_mathiu::impl::Pair_*,_bool,_const_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_*,_bool,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_bool,_const_mathiu::impl::True_*,_bool,_const_mathiu::impl::False_*,_bool,_const_mathiu::impl::Logical_*,_bool,_const_mathiu::impl::And_*,_bool,_const_mathiu::impl::Logical_*,_bool,_const_mathiu::impl::Or_*,_bool,_const_mathiu::impl::SetOp_*,_bool,_const_mathiu::impl::Union_*,_bool,_const_mathiu::impl::SetOp_*,_bool,_const_mathiu::impl::Intersection_*,_bool,_const_mathiu::impl::SetOp_*,_bool,_const_mathiu::impl::Difference_*,_bool>
           *context)

{
  type tVar1;
  Type *__t;
  anon_class_24_3_4faffc98 local_40;
  Context<const_int_*,_bool,_const_mathiu::impl::Fraction_*,_bool,_const_mathiu::impl::Symbol_*,_bool,_const_mathiu::impl::Sum_*,_bool,_const_mathiu::impl::Product_*,_bool,_const_mathiu::impl::Power_*,_bool,_const_mathiu::impl::Log_*,_bool,_const_mathiu::impl::Sin_*,_bool,_const_mathiu::impl::Pi_*,_bool,_const_mathiu::impl::E_*,_bool,_const_mathiu::impl::I_*,_bool,_const_mathiu::impl::Infinity_*,_bool,_const_mathiu::impl::Set_*,_bool,_const_mathiu::impl::List_*,_bool,_const_mathiu::impl::PieceWise_*,_bool,_const_std::tuple<mathiu::impl::RelationalKind,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_*,_bool,_const_mathiu::impl::Pair_*,_bool,_const_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_*,_bool,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_bool,_const_mathiu::impl::True_*,_bool,_const_mathiu::impl::False_*,_bool,_const_mathiu::impl::Logical_*,_bool,_const_mathiu::impl::And_*,_bool,_const_mathiu::impl::Logical_*,_bool,_const_mathiu::impl::Or_*,_bool,_const_mathiu::impl::SetOp_*,_bool,_const_mathiu::impl::Union_*,_bool,_const_mathiu::impl::SetOp_*,_bool,_const_mathiu::impl::Intersection_*,_bool,_const_mathiu::impl::SetOp_*,_bool,_const_mathiu::impl::Difference_*,_bool>
  *local_28;
  Context<const_int_*,_bool,_const_mathiu::impl::Fraction_*,_bool,_const_mathiu::impl::Symbol_*,_bool,_const_mathiu::impl::Sum_*,_bool,_const_mathiu::impl::Product_*,_bool,_const_mathiu::impl::Power_*,_bool,_const_mathiu::impl::Log_*,_bool,_const_mathiu::impl::Sin_*,_bool,_const_mathiu::impl::Pi_*,_bool,_const_mathiu::impl::E_*,_bool,_const_mathiu::impl::I_*,_bool,_const_mathiu::impl::Infinity_*,_bool,_const_mathiu::impl::Set_*,_bool,_const_mathiu::impl::List_*,_bool,_const_mathiu::impl::PieceWise_*,_bool,_const_std::tuple<mathiu::impl::RelationalKind,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_*,_bool,_const_mathiu::impl::Pair_*,_bool,_const_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_*,_bool,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_bool,_const_mathiu::impl::True_*,_bool,_const_mathiu::impl::False_*,_bool,_const_mathiu::impl::Logical_*,_bool,_const_mathiu::impl::And_*,_bool,_const_mathiu::impl::Logical_*,_bool,_const_mathiu::impl::Or_*,_bool,_const_mathiu::impl::SetOp_*,_bool,_const_mathiu::impl::Union_*,_bool,_const_mathiu::impl::SetOp_*,_bool,_const_mathiu::impl::Intersection_*,_bool,_const_mathiu::impl::SetOp_*,_bool,_const_mathiu::impl::Difference_*,_bool>
  *context_local;
  Ds<matchit::impl::Id<mathiu::impl::RelationalKind>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>
  *pDStack_18;
  int32_t depth_local;
  Ds<matchit::impl::Id<mathiu::impl::RelationalKind>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>
  *dsPat_local;
  tuple<mathiu::impl::RelationalKind,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>
  *valueTuple_local;
  
  local_40.valueTuple = valueTuple;
  local_40.depth = depth;
  local_40.context = context;
  local_28 = context;
  context_local._4_4_ = depth;
  pDStack_18 = dsPat;
  dsPat_local = (Ds<matchit::impl::Id<mathiu::impl::RelationalKind>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>
                 *)valueTuple;
  __t = Ds<matchit::impl::Id<mathiu::impl::RelationalKind>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>
        ::patterns(dsPat);
  tVar1 = std::
          apply<matchit::impl::PatternTraits<matchit::impl::Ds<matchit::impl::Id<mathiu::impl::RelationalKind>,matchit::impl::Id<std::shared_ptr<mathiu::impl::Expr_const>>,matchit::impl::Id<std::shared_ptr<mathiu::impl::Expr_const>>>>::matchPatternImpl<std::tuple<mathiu::impl::RelationalKind,std::shared_ptr<mathiu::impl::Expr_const>,std::shared_ptr<mathiu::impl::Expr_const>>const&,matchit::impl::Context<int_const*,bool,mathiu::impl::Fraction_const*,bool,mathiu::impl::Symbol_const*,bool,mathiu::impl::Sum_const*,bool,mathiu::impl::Product_const*,bool,mathiu::impl::Power_const*,bool,mathiu::impl::Log_const*,bool,mathiu::impl::Sin_const*,bool,mathiu::impl::Pi_const*,bool,mathiu::impl::E_const*,bool,mathiu::impl::I_const*,bool,mathiu::impl::Infinity_const*,bool,mathiu::impl::Set_const*,bool,mathiu::impl::List_const*,bool,mathiu::impl::PieceWise_const*,bool,std::tuple<mathiu::impl::RelationalKind,std::shared_ptr<mathiu::impl::Expr_const>,std::shared_ptr<mathiu::impl::Expr_const>>const*,bool,mathiu::im____ptr<mathiu::impl::Expr_const>>,matchit::impl::Id<std::shared_ptr<mathiu::impl::Expr_const>>>const&>
                    (&local_40,__t);
  return tVar1;
}

Assistant:

constexpr static auto matchPatternImpl(ValueTuple &&valueTuple,
                                                   Ds<Patterns...> const &dsPat,
                                                   int32_t depth, ContextT &context)
                -> std::enable_if_t<isTupleLikeV<ValueTuple>, bool>
            {
                if constexpr (nbOooOrBinder == 0)
                {
                    return std::apply(
                        [&valueTuple, depth, &context](auto const &...patterns)
                        {
                            return apply_(
                                [ depth, &context, &patterns... ](auto &&...values) constexpr
                                {
                                    static_assert(sizeof...(patterns) == sizeof...(values));
                                    return (matchPattern(std::forward<decltype(values)>(values),
                                                         patterns, depth + 1, context) &&
                                            ...);
                                },
                                valueTuple);
                        },
                        dsPat.patterns());
                }
                else if constexpr (nbOooOrBinder == 1)
                {
                    constexpr auto idxOoo = findOooIdx<typename Ds<Patterns...>::Type>();
                    constexpr auto isBinder =
                        isOooBinderV<std::tuple_element_t<idxOoo, std::tuple<Patterns...>>>;
                    constexpr auto isArray = isArrayV<ValueTuple>;
                    auto result = matchPatternMultiple<0, 0, idxOoo>(
                        std::forward<ValueTuple>(valueTuple), dsPat.patterns(), depth,
                        context);
                    constexpr auto valLen = std::tuple_size_v<std::decay_t<ValueTuple>>;
                    constexpr auto patLen = sizeof...(Patterns);
                    if constexpr (isArray)
                    {
                        if constexpr (isBinder)
                        {
                            auto const rangeSize = static_cast<long>(valLen - (patLen - 1));
                            context.emplace_back(makeSubrange(&valueTuple[idxOoo],
                                                              &valueTuple[idxOoo] + rangeSize));
                            using type = decltype(makeSubrange(&valueTuple[idxOoo],
                                                               &valueTuple[idxOoo] + rangeSize));
                            result = result && matchPattern(std::get<type>(context.back()),
                                                            std::get<idxOoo>(dsPat.patterns()),
                                                            depth, context);
                        }
                    }
                    else
                    {
                        static_assert(!isBinder);
                    }
                    return result && matchPatternMultiple<valLen - patLen + idxOoo + 1,
                                                          idxOoo + 1, patLen - idxOoo - 1>(
                                         std::forward<ValueTuple>(valueTuple),
                                         dsPat.patterns(), depth, context);
                }
            }